

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O1

size_t duckdb_zstd::HUF_decompress4X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  byte *srcBuffer;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  undefined2 uVar7;
  long lVar8;
  char cVar9;
  ulong uVar10;
  size_t sVar11;
  byte bVar12;
  ulong uVar13;
  undefined1 *puVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  BitContainerType BVar18;
  undefined1 *puVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ulong *puVar23;
  undefined1 *puVar24;
  int iVar25;
  undefined1 *puVar26;
  int iVar27;
  undefined4 in_register_0000008c;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  uint local_134;
  ulong *local_130;
  ulong local_128;
  ulong *local_108;
  ulong local_100;
  ulong local_f0;
  uint local_e4;
  BIT_DStream_t local_e0;
  undefined1 *local_b8;
  ulong *local_b0;
  ulong *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_88;
  ulong *local_80;
  ulong *local_78;
  ulong *local_70;
  ulong *local_68;
  ulong local_60;
  
  if ((flags & 1U) != 0) {
    if (((flags & 0x20U) == 0) &&
       (sVar11 = HUF_decompress4X1_usingDTable_internal_fast
                           (dst,dstSize,cSrc,cSrcSize,DTable,
                            (HUF_DecompressFastLoopFn)CONCAT44(in_register_0000008c,flags)),
       sVar11 != 0)) {
      return sVar11;
    }
    sVar11 = HUF_decompress4X1_usingDTable_internal_bmi2(dst,dstSize,cSrc,cSrcSize,DTable);
    return sVar11;
  }
  if (dstSize < 6 || cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar4 = *cSrc;
  uVar30 = (ulong)uVar4;
  uVar5 = *(ushort *)((long)cSrc + 2);
  uVar13 = (ulong)uVar5;
  uVar6 = *(ushort *)((long)cSrc + 4);
  uVar10 = (ulong)uVar6;
  uVar16 = uVar30 + uVar13 + uVar10 + 6;
  if (cSrcSize < uVar16) {
    return 0xffffffffffffffec;
  }
  local_a0 = (undefined1 *)(dstSize + (long)dst);
  local_60 = dstSize + 3 >> 2;
  local_88 = (undefined1 *)(local_60 + (long)dst);
  local_98 = local_88 + local_60;
  local_b8 = local_98 + local_60;
  if (local_a0 < local_b8) {
    return 0xffffffffffffffec;
  }
  local_a8 = (ulong *)((long)cSrc + uVar30 + 6);
  if (uVar30 == 0) {
    uVar17 = 0xffffffffffffffb8;
    local_108 = (ulong *)0x0;
    puVar23 = (ulong *)0x0;
    local_70 = (ulong *)0x0;
    uVar29 = 0;
    local_128 = 0;
  }
  else {
    puVar23 = (ulong *)((long)cSrc + 6);
    local_70 = (ulong *)((long)cSrc + 0xe);
    if (uVar4 < 8) {
      local_128 = (ulong)*(byte *)puVar23;
      switch(uVar4) {
      case 7:
        local_128 = local_128 | (ulong)*(byte *)((long)cSrc + 0xc) << 0x30;
      case 6:
        local_128 = local_128 + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
      case 5:
        local_128 = local_128 + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
      case 4:
        local_128 = local_128 + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
      case 3:
        local_128 = local_128 + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
      case 2:
        local_128 = local_128 + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
      default:
        bVar12 = *(byte *)((long)cSrc + uVar30 + 5);
        uVar28 = 0x1f;
        if (bVar12 != 0) {
          for (; bVar12 >> uVar28 == 0; uVar28 = uVar28 - 1) {
          }
        }
        if (bVar12 == 0) {
          uVar17 = 0xffffffffffffffec;
          uVar28 = 0;
        }
        else {
          uVar28 = ~uVar28 + 9 + ((uint)uVar4 * -8 + 0x40 & 0xffff);
          uVar17 = uVar30;
        }
        uVar29 = (ulong)uVar28;
        local_108 = puVar23;
      }
    }
    else {
      local_128 = *(ulong *)((long)cSrc + (uVar30 - 2));
      bVar12 = *(byte *)((long)cSrc + uVar30 + 5);
      uVar28 = 0x1f;
      if (bVar12 != 0) {
        for (; bVar12 >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      uVar28 = ~uVar28 + 9;
      if (bVar12 == 0) {
        uVar28 = 0;
      }
      uVar29 = (ulong)uVar28;
      uVar17 = uVar30 | -(ulong)(bVar12 == 0);
      local_108 = (ulong *)((long)cSrc + (uVar30 - 2));
    }
  }
  if (0xffffffffffffff88 < uVar17) {
    return uVar17;
  }
  local_68 = (ulong *)((long)local_a8 + uVar13);
  if (uVar13 == 0) {
    uVar13 = 0xffffffffffffffb8;
    local_f0 = 0;
    local_134 = 0;
    local_b0 = (ulong *)0x0;
    local_a8 = (ulong *)0x0;
    local_78 = (ulong *)0x0;
  }
  else {
    local_78 = (ulong *)((long)cSrc + uVar30 + 0xe);
    if (7 < uVar5) {
      local_f0 = local_68[-1];
      bVar12 = *(byte *)((long)local_68 + -1);
      uVar28 = 0x1f;
      if (bVar12 != 0) {
        for (; bVar12 >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      local_134 = ~uVar28 + 9;
      if (bVar12 == 0) {
        local_134 = 0;
      }
      uVar13 = uVar13 | -(ulong)(bVar12 == 0);
      local_b0 = local_68 + -1;
      goto LAB_01dbabbf;
    }
    local_f0 = (ulong)(byte)*local_a8;
    switch(uVar5) {
    case 2:
      break;
    case 7:
      local_f0 = local_f0 | (ulong)*(byte *)((long)cSrc + uVar30 + 0xc) << 0x30;
    case 6:
      local_f0 = local_f0 + ((ulong)*(byte *)((long)cSrc + uVar30 + 0xb) << 0x28);
    case 5:
      local_f0 = local_f0 + ((ulong)*(byte *)((long)cSrc + uVar30 + 10) << 0x20);
    case 4:
      local_f0 = local_f0 + (ulong)*(byte *)((long)cSrc + uVar30 + 9) * 0x1000000;
    case 3:
      local_f0 = local_f0 + (ulong)*(byte *)((long)cSrc + uVar30 + 8) * 0x10000;
      break;
    default:
      goto switchD_01dbab21_default;
    }
    local_f0 = local_f0 + (ulong)*(byte *)((long)cSrc + uVar30 + 7) * 0x100;
switchD_01dbab21_default:
    bVar12 = *(byte *)((long)local_68 + -1);
    uVar28 = 0x1f;
    if (bVar12 != 0) {
      for (; bVar12 >> uVar28 == 0; uVar28 = uVar28 - 1) {
      }
    }
    local_b0 = local_a8;
    if (bVar12 == 0) {
      uVar13 = 0xffffffffffffffec;
      local_134 = 0;
    }
    else {
      local_134 = ~uVar28 + 9 + ((uint)uVar5 * -8 + 0x40 & 0xffff);
    }
  }
LAB_01dbabbf:
  if (0xffffffffffffff88 < uVar13) {
    return uVar13;
  }
  srcBuffer = (byte *)((long)local_68 + uVar10);
  if (uVar10 == 0) {
    uVar10 = 0xffffffffffffffb8;
    local_100 = 0;
    local_e4 = 0;
    local_130 = (ulong *)0x0;
    local_68 = (ulong *)0x0;
    local_80 = (ulong *)0x0;
  }
  else {
    local_80 = local_68 + 1;
    if (uVar6 < 8) {
      local_100 = (ulong)(byte)*local_68;
      switch(uVar6) {
      case 7:
        local_100 = local_100 | (ulong)*(byte *)((long)local_68 + 6) << 0x30;
      case 6:
        local_100 = local_100 + ((ulong)*(byte *)((long)local_68 + 5) << 0x28);
      case 5:
        local_100 = local_100 + ((ulong)*(byte *)((long)local_68 + 4) << 0x20);
      case 4:
        local_100 = local_100 + (ulong)*(byte *)((long)local_68 + 3) * 0x1000000;
      case 3:
        local_100 = local_100 + (ulong)*(byte *)((long)local_68 + 2) * 0x10000;
      case 2:
        local_100 = local_100 + (ulong)*(byte *)((long)local_68 + 1) * 0x100;
      default:
        bVar12 = srcBuffer[-1];
        uVar28 = 0x1f;
        if (bVar12 != 0) {
          for (; bVar12 >> uVar28 == 0; uVar28 = uVar28 - 1) {
          }
        }
        local_130 = local_68;
        if (bVar12 == 0) {
          uVar10 = 0xffffffffffffffec;
          local_e4 = 0;
        }
        else {
          local_e4 = ~uVar28 + 9 + ((uint)uVar6 * -8 + 0x40 & 0xffff);
        }
      }
    }
    else {
      local_100 = *(ulong *)(srcBuffer + -8);
      bVar12 = srcBuffer[-1];
      uVar28 = 0x1f;
      if (bVar12 != 0) {
        for (; bVar12 >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      local_e4 = ~uVar28 + 9;
      if (bVar12 == 0) {
        local_e4 = 0;
      }
      uVar10 = uVar10 | -(ulong)(bVar12 == 0);
      local_130 = (ulong *)(srcBuffer + -8);
    }
  }
  if (0xffffffffffffff88 < uVar10) {
    return uVar10;
  }
  uVar7 = *(undefined2 *)((long)DTable + 2);
  sVar11 = BIT_initDStream(&local_e0,srcBuffer,cSrcSize - uVar16);
  if (0xffffffffffffff88 < sVar11) {
    return sVar11;
  }
  puVar14 = (undefined1 *)((long)dst + (dstSize - 3));
  cVar9 = (char)uVar7;
  puVar24 = local_98;
  puVar26 = local_88;
  puVar19 = local_b8;
  if (local_b8 < puVar14 && 7 < (ulong)((long)local_a0 - (long)local_b8)) {
    bVar12 = -cVar9 & 0x3f;
    lVar8 = local_60 * 3;
    BVar18 = local_e0.bitContainer;
    do {
      puVar24 = (undefined1 *)dst;
      uVar10 = (local_128 << ((byte)uVar29 & 0x3f)) >> bVar12;
      uVar13 = (local_f0 << ((byte)local_134 & 0x3f)) >> bVar12;
      uVar16 = (local_100 << ((byte)local_e4 & 0x3f)) >> bVar12;
      iVar20 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + (int)uVar29;
      uVar30 = (BVar18 << ((byte)local_e0.bitsConsumed & 0x3f)) >> bVar12;
      uVar17 = (local_128 << ((byte)iVar20 & 0x3f)) >> bVar12;
      *puVar24 = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      iVar22 = *(byte *)((long)DTable + uVar13 * 2 + 4) + local_134;
      puVar24[local_60] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar25 = *(byte *)((long)DTable + uVar16 * 2 + 4) + local_e4;
      puVar24[local_60 * 2] = *(undefined1 *)((long)DTable + uVar16 * 2 + 5);
      iVar27 = *(byte *)((long)DTable + uVar30 * 2 + 4) + local_e0.bitsConsumed;
      puVar24[lVar8] = *(undefined1 *)((long)DTable + uVar30 * 2 + 5);
      uVar10 = (local_f0 << ((byte)iVar22 & 0x3f)) >> bVar12;
      uVar30 = (local_100 << ((byte)iVar25 & 0x3f)) >> bVar12;
      iVar20 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar20;
      uVar13 = (BVar18 << ((byte)iVar27 & 0x3f)) >> bVar12;
      uVar16 = (local_128 << ((byte)iVar20 & 0x3f)) >> bVar12;
      puVar24[1] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
      iVar22 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar22;
      puVar24[local_60 + 1] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      iVar25 = (uint)*(byte *)((long)DTable + uVar30 * 2 + 4) + iVar25;
      puVar24[local_60 * 2 + 1] = *(undefined1 *)((long)DTable + uVar30 * 2 + 5);
      iVar27 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar27;
      puVar24[lVar8 + 1] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar20;
      puVar24[2] = *(undefined1 *)((long)DTable + uVar16 * 2 + 5);
      uVar10 = (local_f0 << ((byte)iVar22 & 0x3f)) >> bVar12;
      uVar13 = (local_100 << ((byte)iVar25 & 0x3f)) >> bVar12;
      iVar22 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar22;
      uVar16 = (BVar18 << ((byte)iVar27 & 0x3f)) >> bVar12;
      uVar30 = (local_128 << ((byte)iVar20 & 0x3f)) >> bVar12;
      puVar24[local_60 + 2] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      iVar25 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar25;
      puVar24[local_60 * 2 + 2] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar27 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar27;
      puVar24[lVar8 + 2] = *(undefined1 *)((long)DTable + uVar16 * 2 + 5);
      uVar28 = (uint)*(byte *)((long)DTable + uVar30 * 2 + 4) + iVar20;
      puVar24[3] = *(undefined1 *)((long)DTable + uVar30 * 2 + 5);
      uVar10 = (local_f0 << ((byte)iVar22 & 0x3f)) >> bVar12;
      bVar1 = *(byte *)((long)DTable + uVar10 * 2 + 4);
      puVar24[local_60 + 3] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      uVar10 = (local_100 << ((byte)iVar25 & 0x3f)) >> bVar12;
      bVar2 = *(byte *)((long)DTable + uVar10 * 2 + 4);
      puVar24[local_60 * 2 + 3] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      uVar10 = (BVar18 << ((byte)iVar27 & 0x3f)) >> bVar12;
      bVar3 = *(byte *)((long)DTable + uVar10 * 2 + 4);
      puVar24[lVar8 + 3] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      iVar20 = 3;
      if (local_108 < local_70) {
        iVar21 = 3;
      }
      else {
        local_108 = (ulong *)((long)local_108 - (ulong)(uVar28 >> 3));
        uVar28 = uVar28 & 7;
        local_128 = *local_108;
        iVar21 = 0;
      }
      uVar29 = (ulong)uVar28;
      local_134 = iVar22 + (uint)bVar1;
      if (local_78 <= local_b0) {
        local_b0 = (ulong *)((long)local_b0 - (ulong)(local_134 >> 3));
        local_134 = local_134 & 7;
        local_f0 = *local_b0;
        iVar20 = 0;
      }
      local_e4 = iVar25 + (uint)bVar2;
      iVar25 = 3;
      if (local_130 < local_80) {
        iVar22 = 3;
      }
      else {
        local_130 = (ulong *)((long)local_130 - (ulong)(local_e4 >> 3));
        local_e4 = local_e4 & 7;
        local_100 = *local_130;
        iVar22 = 0;
      }
      local_e0.bitsConsumed = iVar27 + (uint)bVar3;
      if (local_e0.limitPtr <= local_e0.ptr) {
        local_e0.ptr = (char *)((long)local_e0.ptr - (ulong)(local_e0.bitsConsumed >> 3));
        local_e0.bitsConsumed = local_e0.bitsConsumed & 7;
        BVar18 = *(BitContainerType *)local_e0.ptr;
        iVar25 = 0;
        local_e0.bitContainer = BVar18;
      }
    } while ((puVar24 + lVar8 + 4 < puVar14) &&
            (dst = puVar24 + 4, ((iVar20 == 0 && iVar21 == 0) && iVar22 == 0) && iVar25 == 0));
    dst = puVar24 + 4;
    puVar24 = (undefined1 *)((long)dst + local_60 * 2);
    puVar26 = (undefined1 *)((long)dst + local_60);
    puVar19 = (undefined1 *)((long)dst + lVar8);
  }
  if ((local_88 < dst) || (local_98 < puVar26)) {
    return 0xffffffffffffffec;
  }
  if (local_b8 < puVar24) {
    return 0xffffffffffffffec;
  }
  if (3 < (long)local_88 - (long)dst) {
    bVar12 = -cVar9 & 0x3f;
    do {
      uVar28 = (uint)uVar29;
      if (uVar28 < 0x41) {
        if (local_108 < local_70) {
          if (local_108 == puVar23) {
            bVar31 = false;
            goto LAB_01dbb284;
          }
          bVar31 = puVar23 <= (ulong *)((long)local_108 - (uVar29 >> 3));
          uVar15 = (int)local_108 - (int)puVar23;
          if (bVar31) {
            uVar15 = (uint)(uVar29 >> 3);
          }
          uVar28 = uVar28 + uVar15 * -8;
        }
        else {
          uVar15 = (uint)(uVar29 >> 3);
          uVar28 = uVar28 & 7;
          bVar31 = true;
        }
        uVar29 = (ulong)uVar28;
        local_108 = (ulong *)((long)local_108 - (ulong)uVar15);
        local_128 = *local_108;
      }
      else {
        bVar31 = false;
        local_108 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
      }
LAB_01dbb284:
      if ((local_88 + -3 <= dst) || (!bVar31)) goto LAB_01dbb3d6;
      uVar10 = (local_128 << ((byte)uVar29 & 0x3f)) >> bVar12;
      iVar20 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + (int)uVar29;
      uVar13 = (local_128 << ((byte)iVar20 & 0x3f)) >> bVar12;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar20;
      uVar10 = (local_128 << ((byte)iVar20 & 0x3f)) >> bVar12;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar20;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      uVar10 = (local_128 << ((byte)iVar20 & 0x3f)) >> bVar12;
      uVar29 = (ulong)((uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar20);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      dst = (void *)((long)dst + 4);
    } while( true );
  }
  uVar28 = (uint)uVar29;
  if (uVar28 < 0x41) {
    if (local_108 < local_70) {
      if (local_108 == puVar23) goto LAB_01dbb3d6;
      uVar15 = (int)local_108 - (int)puVar23;
      if (puVar23 <= (ulong *)((long)local_108 - (uVar29 >> 3))) {
        uVar15 = (uint)(uVar29 >> 3);
      }
      uVar28 = uVar28 + uVar15 * -8;
    }
    else {
      uVar15 = (uint)(uVar29 >> 3);
      uVar28 = uVar28 & 7;
    }
    uVar29 = (ulong)uVar28;
    local_108 = (ulong *)((long)local_108 - (ulong)uVar15);
    local_128 = *local_108;
  }
  else {
    local_108 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
  }
LAB_01dbb3d6:
  uVar28 = (uint)uVar29;
  if (dst < local_88) {
    do {
      uVar10 = (local_128 << ((byte)uVar29 & 0x3f)) >> (-cVar9 & 0x3fU);
      uVar28 = (int)uVar29 + (uint)*(byte *)((long)DTable + uVar10 * 2 + 4);
      uVar29 = (ulong)uVar28;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      dst = (void *)((long)dst + 1);
    } while (dst < local_88);
  }
  if (3 < (long)local_98 - (long)puVar26) {
    bVar12 = -cVar9 & 0x3f;
    do {
      if (local_134 < 0x41) {
        if (local_b0 < local_78) {
          if (local_b0 == local_a8) {
            bVar31 = false;
            goto LAB_01dbb4e7;
          }
          bVar31 = local_a8 <= (ulong *)((long)local_b0 - (ulong)(local_134 >> 3));
          uVar15 = (int)local_b0 - (int)local_a8;
          if (bVar31) {
            uVar15 = local_134 >> 3;
          }
          local_134 = local_134 + uVar15 * -8;
        }
        else {
          uVar15 = local_134 >> 3;
          local_134 = local_134 & 7;
          bVar31 = true;
        }
        local_b0 = (ulong *)((long)local_b0 - (ulong)uVar15);
        local_f0 = *local_b0;
      }
      else {
        bVar31 = false;
        local_b0 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
      }
LAB_01dbb4e7:
      if ((local_98 + -3 <= puVar26) || (!bVar31)) goto LAB_01dbb616;
      uVar10 = (local_f0 << ((byte)local_134 & 0x3f)) >> bVar12;
      iVar20 = *(byte *)((long)DTable + uVar10 * 2 + 4) + local_134;
      uVar13 = (local_f0 << ((byte)iVar20 & 0x3f)) >> bVar12;
      *puVar26 = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar20;
      uVar10 = (local_f0 << ((byte)iVar20 & 0x3f)) >> bVar12;
      puVar26[1] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar20;
      puVar26[2] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      uVar10 = (local_f0 << ((byte)iVar20 & 0x3f)) >> bVar12;
      local_134 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar20;
      puVar26[3] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      puVar26 = puVar26 + 4;
    } while( true );
  }
  if (local_134 < 0x41) {
    if (local_b0 < local_78) {
      if (local_b0 == local_a8) goto LAB_01dbb616;
      uVar15 = (int)local_b0 - (int)local_a8;
      if (local_a8 <= (ulong *)((long)local_b0 - (ulong)(local_134 >> 3))) {
        uVar15 = local_134 >> 3;
      }
      local_134 = local_134 + uVar15 * -8;
    }
    else {
      uVar15 = local_134 >> 3;
      local_134 = local_134 & 7;
    }
    local_b0 = (ulong *)((long)local_b0 - (ulong)uVar15);
    local_f0 = *local_b0;
  }
  else {
    local_b0 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
  }
LAB_01dbb616:
  if (puVar26 < local_98) {
    do {
      uVar10 = (local_f0 << ((byte)local_134 & 0x3f)) >> (-cVar9 & 0x3fU);
      local_134 = local_134 + *(byte *)((long)DTable + uVar10 * 2 + 4);
      *puVar26 = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      puVar26 = puVar26 + 1;
    } while (puVar26 < local_98);
  }
  if (3 < (long)local_b8 - (long)puVar24) {
    bVar12 = -cVar9 & 0x3f;
    do {
      if (local_e4 < 0x41) {
        if (local_130 < local_80) {
          if (local_130 == local_68) {
            bVar31 = false;
            goto LAB_01dbb70e;
          }
          bVar31 = local_68 <= (ulong *)((long)local_130 - (ulong)(local_e4 >> 3));
          uVar15 = (int)local_130 - (int)local_68;
          if (bVar31) {
            uVar15 = local_e4 >> 3;
          }
          local_e4 = local_e4 + uVar15 * -8;
        }
        else {
          uVar15 = local_e4 >> 3;
          local_e4 = local_e4 & 7;
          bVar31 = true;
        }
        local_130 = (ulong *)((long)local_130 - (ulong)uVar15);
        local_100 = *local_130;
      }
      else {
        bVar31 = false;
        local_130 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
      }
LAB_01dbb70e:
      if ((local_b8 + -3 <= puVar24) || (!bVar31)) goto LAB_01dbb857;
      uVar10 = (local_100 << ((byte)local_e4 & 0x3f)) >> bVar12;
      iVar20 = *(byte *)((long)DTable + uVar10 * 2 + 4) + local_e4;
      uVar13 = (local_100 << ((byte)iVar20 & 0x3f)) >> bVar12;
      *puVar24 = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar20;
      uVar10 = (local_100 << ((byte)iVar20 & 0x3f)) >> bVar12;
      puVar24[1] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar20;
      puVar24[2] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      uVar10 = (local_100 << ((byte)iVar20 & 0x3f)) >> bVar12;
      local_e4 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar20;
      puVar24[3] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      puVar24 = puVar24 + 4;
    } while( true );
  }
  if (local_e4 < 0x41) {
    if (local_130 < local_80) {
      if (local_130 == local_68) goto LAB_01dbb857;
      uVar15 = (int)local_130 - (int)local_68;
      if (local_68 <= (ulong *)((long)local_130 - (ulong)(local_e4 >> 3))) {
        uVar15 = local_e4 >> 3;
      }
      local_e4 = local_e4 + uVar15 * -8;
    }
    else {
      uVar15 = local_e4 >> 3;
      local_e4 = local_e4 & 7;
    }
    local_130 = (ulong *)((long)local_130 - (ulong)uVar15);
    local_100 = *local_130;
  }
  else {
    local_130 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
  }
LAB_01dbb857:
  if (puVar24 < local_b8) {
    do {
      uVar10 = (local_100 << ((byte)local_e4 & 0x3f)) >> (-cVar9 & 0x3fU);
      local_e4 = local_e4 + *(byte *)((long)DTable + uVar10 * 2 + 4);
      *puVar24 = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      puVar24 = puVar24 + 1;
    } while (puVar24 < local_b8);
  }
  if (3 < (long)local_a0 - (long)puVar19) {
    bVar12 = -cVar9 & 0x3f;
    do {
      if (local_e0.bitsConsumed < 0x41) {
        if (local_e0.ptr < local_e0.limitPtr) {
          if (local_e0.ptr == local_e0.start) goto LAB_01dbb94b;
          bVar31 = local_e0.start <=
                   (BitContainerType *)((long)local_e0.ptr - (ulong)(local_e0.bitsConsumed >> 3));
          uVar15 = (int)local_e0.ptr - (int)local_e0.start;
          if (bVar31) {
            uVar15 = local_e0.bitsConsumed >> 3;
          }
          local_e0.ptr = (char *)((long)local_e0.ptr - (ulong)uVar15);
          local_e0.bitsConsumed = local_e0.bitsConsumed + uVar15 * -8;
          local_e0.bitContainer = *(BitContainerType *)local_e0.ptr;
        }
        else {
          local_e0.ptr = (char *)((long)local_e0.ptr - (ulong)(local_e0.bitsConsumed >> 3));
          local_e0.bitsConsumed = local_e0.bitsConsumed & 7;
          local_e0.bitContainer = *(BitContainerType *)local_e0.ptr;
          bVar31 = true;
        }
      }
      else {
        local_e0.ptr = "";
LAB_01dbb94b:
        bVar31 = false;
      }
      if ((puVar14 <= puVar19) || (!bVar31)) goto LAB_01dbbadd;
      uVar10 = (local_e0.bitContainer << ((byte)local_e0.bitsConsumed & 0x3f)) >> bVar12;
      iVar20 = *(byte *)((long)DTable + uVar10 * 2 + 4) + local_e0.bitsConsumed;
      *puVar19 = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      uVar10 = (local_e0.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
      iVar20 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar20;
      puVar19[1] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      uVar10 = (local_e0.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
      iVar20 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar20;
      puVar19[2] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      uVar10 = (local_e0.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
      local_e0.bitsConsumed = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar20;
      puVar19[3] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      puVar19 = puVar19 + 4;
    } while( true );
  }
  if (local_e0.bitsConsumed < 0x41) {
    if (local_e0.ptr < local_e0.limitPtr) {
      if (local_e0.ptr == local_e0.start) goto LAB_01dbbadd;
      uVar15 = (int)local_e0.ptr - (int)local_e0.start;
      if (local_e0.start <=
          (BitContainerType *)((long)local_e0.ptr - (ulong)(local_e0.bitsConsumed >> 3))) {
        uVar15 = local_e0.bitsConsumed >> 3;
      }
      local_e0.bitsConsumed = local_e0.bitsConsumed + uVar15 * -8;
    }
    else {
      uVar15 = local_e0.bitsConsumed >> 3;
      local_e0.bitsConsumed = local_e0.bitsConsumed & 7;
    }
    local_e0.ptr = (char *)((long)local_e0.ptr - (ulong)uVar15);
    local_e0.bitContainer = *(BitContainerType *)local_e0.ptr;
  }
  else {
    local_e0.ptr = "";
  }
LAB_01dbbadd:
  if (puVar19 < local_a0) {
    do {
      uVar10 = (local_e0.bitContainer << ((byte)local_e0.bitsConsumed & 0x3f)) >> (-cVar9 & 0x3fU);
      local_e0.bitsConsumed = *(byte *)((long)DTable + uVar10 * 2 + 4) + local_e0.bitsConsumed;
      *puVar19 = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      puVar19 = puVar19 + 1;
    } while (puVar19 < local_a0);
  }
  if (local_e0.bitsConsumed != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_e0.ptr != local_e0.start) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_e4 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_130 != local_68) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_134 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_b0 != local_a8) {
    dstSize = 0xffffffffffffffec;
  }
  if (uVar28 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_108 != puVar23) {
    dstSize = 0xffffffffffffffec;
  }
  return dstSize;
}

Assistant:

static size_t HUF_decompress4X1_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X1_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X1_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X1_usingDTable_internal_bmi2;
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif
    if (HUF_ENABLE_FAST_DECODE && !(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X1_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}